

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O1

void multikey_cache<4u,true>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  size_t i;
  ulong uVar15;
  Cacheblock<4U>_conflict *pCVar16;
  long lVar17;
  Cacheblock<4U>_conflict *pCVar18;
  Cacheblock<4U>_conflict *pCVar19;
  ulong uVar20;
  uint uVar21;
  Cacheblock<4U>_conflict *pCVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  byte bVar26;
  size_t sVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  
  lVar30 = depth + 1;
LAB_00223f19:
  if (0x1f < N) {
    uVar15 = 0;
    do {
      uVar21 = 0;
      lVar17 = 0x20;
      sVar27 = depth;
      do {
        if (lVar17 == 0) break;
        pbVar1 = cache[uVar15].ptr + sVar27;
        lVar17 = lVar17 + -8;
        uVar21 = uVar21 | (uint)*pbVar1 << ((byte)lVar17 & 0x1f);
        sVar27 = sVar27 + 1;
      } while (*pbVar1 != 0);
      cache[uVar15].cached_bytes = uVar21;
      uVar15 = uVar15 + 1;
    } while (uVar15 != N);
    uVar15 = N >> 3;
    uVar21 = cache->cached_bytes;
    uVar4 = cache[uVar15].cached_bytes;
    pCVar16 = cache;
    if (uVar21 != uVar4) {
      pCVar16 = cache + (N >> 2);
      uVar5 = pCVar16->cached_bytes;
      if ((uVar5 != uVar21) && (uVar5 != uVar4)) {
        if (uVar21 < uVar4) {
          if (uVar5 <= uVar21) {
            pCVar16 = cache;
          }
          if (uVar4 < uVar5) {
            pCVar16 = cache + uVar15;
          }
        }
        else {
          if (uVar21 < uVar5) {
            pCVar16 = cache;
          }
          if (uVar5 < uVar4) {
            pCVar16 = cache + uVar15;
          }
        }
      }
    }
    uVar28 = N >> 1;
    pCVar18 = cache + (uVar28 - uVar15);
    uVar21 = cache[uVar28 - uVar15].cached_bytes;
    uVar4 = cache[uVar28].cached_bytes;
    pCVar19 = pCVar18;
    if (uVar21 != uVar4) {
      pCVar22 = cache + uVar28;
      pCVar19 = pCVar22 + uVar15;
      uVar5 = pCVar19->cached_bytes;
      if ((uVar5 != uVar21) && (uVar5 != uVar4)) {
        if (uVar21 < uVar4) {
          if (uVar21 < uVar5) {
            pCVar18 = pCVar19;
          }
          pCVar19 = pCVar18;
          if (uVar4 < uVar5) {
            pCVar19 = pCVar22;
          }
        }
        else {
          if (uVar21 < uVar5) {
            pCVar19 = pCVar18;
          }
          if (uVar5 < uVar4) {
            pCVar19 = pCVar22;
          }
        }
      }
    }
    lVar29 = (N - (N >> 2)) + -1;
    pCVar18 = cache + lVar29;
    lVar17 = (N - uVar15) + -1;
    uVar21 = cache[lVar29].cached_bytes;
    uVar4 = cache[lVar17].cached_bytes;
    pCVar22 = pCVar18;
    if (uVar21 != uVar4) {
      pCVar22 = cache + (N - 3);
      uVar5 = pCVar22->cached_bytes;
      if ((uVar5 != uVar21) && (uVar5 != uVar4)) {
        if (uVar21 < uVar4) {
          if (uVar21 < uVar5) {
            pCVar18 = pCVar22;
          }
          pCVar22 = pCVar18;
          if (uVar4 < uVar5) {
            pCVar22 = cache + lVar17;
          }
        }
        else {
          if (uVar21 < uVar5) {
            pCVar22 = pCVar18;
          }
          if (uVar5 < uVar4) {
            pCVar22 = cache + lVar17;
          }
        }
      }
    }
    uVar21 = pCVar16->cached_bytes;
    uVar4 = pCVar19->cached_bytes;
    pCVar18 = pCVar16;
    if (((uVar21 != uVar4) && (uVar5 = pCVar22->cached_bytes, pCVar18 = pCVar22, uVar5 != uVar21))
       && (uVar5 != uVar4)) {
      if (uVar21 < uVar4) {
        if (uVar21 < uVar5) {
          pCVar16 = pCVar22;
        }
        pCVar18 = pCVar16;
        if (uVar4 < uVar5) {
          pCVar18 = pCVar19;
        }
      }
      else {
        if (uVar21 < uVar5) {
          pCVar22 = pCVar16;
        }
        pCVar18 = pCVar22;
        if (uVar5 < uVar4) {
          pCVar18 = pCVar19;
        }
      }
    }
    uVar32 = N - 1;
    uVar13 = cache->cached_bytes;
    uVar14 = *(undefined4 *)&cache->field_0x4;
    puVar6 = cache->ptr;
    uVar12 = *(undefined4 *)&pCVar18->field_0x4;
    puVar7 = pCVar18->ptr;
    cache->cached_bytes = pCVar18->cached_bytes;
    *(undefined4 *)&cache->field_0x4 = uVar12;
    cache->ptr = puVar7;
    pCVar18->cached_bytes = uVar13;
    *(undefined4 *)&pCVar18->field_0x4 = uVar14;
    pCVar18->ptr = puVar6;
    uVar21 = cache->cached_bytes;
    uVar20 = 1;
    uVar28 = 1;
    uVar23 = uVar32;
    uVar15 = uVar32;
LAB_0022410f:
    uVar25 = uVar15;
    if (uVar20 <= uVar23) goto code_r0x00224114;
    goto LAB_00224155;
  }
  pCVar16 = cache;
  if (1 < (long)N) {
    do {
      puVar6 = pCVar16[1].ptr;
      for (pCVar18 = pCVar16 + 1; cache < pCVar18; pCVar18 = pCVar18 + -1) {
        puVar7 = pCVar18[-1].ptr;
        bVar24 = puVar7[depth];
        bVar26 = puVar6[depth];
        if ((bVar24 != 0) && (lVar17 = lVar30, bVar24 == bVar26)) {
          do {
            bVar24 = puVar7[lVar17];
            bVar26 = puVar6[lVar17];
            if (bVar24 == 0) break;
            lVar17 = lVar17 + 1;
          } while (bVar24 == bVar26);
        }
        if (bVar24 <= bVar26) break;
        pCVar18->ptr = puVar7;
      }
      iVar8 = (int)N;
      pCVar18->ptr = puVar6;
      N = (size_t)(iVar8 - 1);
      pCVar16 = pCVar16 + 1;
    } while (2 < iVar8);
  }
  return;
code_r0x00224114:
  pCVar16 = cache + uVar20;
  uVar4 = cache[uVar20].cached_bytes;
  uVar31 = uVar28;
  if (uVar21 > uVar4 || uVar4 == uVar21) {
    if (uVar21 <= uVar4) {
      uVar31 = uVar28 + 1;
      pCVar18 = cache + uVar28;
      uVar13 = pCVar18->cached_bytes;
      uVar14 = *(undefined4 *)&pCVar18->field_0x4;
      puVar6 = pCVar18->ptr;
      uVar12 = *(undefined4 *)&pCVar16->field_0x4;
      puVar7 = pCVar16->ptr;
      pCVar18 = cache + uVar28;
      pCVar18->cached_bytes = pCVar16->cached_bytes;
      *(undefined4 *)&pCVar18->field_0x4 = uVar12;
      pCVar18->ptr = puVar7;
      pCVar16->cached_bytes = uVar13;
      *(undefined4 *)&pCVar16->field_0x4 = uVar14;
      pCVar16->ptr = puVar6;
    }
    uVar20 = uVar20 + 1;
  }
  uVar28 = uVar31;
  if (uVar4 <= uVar21) goto LAB_0022410f;
LAB_00224155:
  do {
    uVar15 = uVar25;
    if (uVar23 < uVar20) break;
    pCVar16 = cache + uVar23;
    uVar4 = cache[uVar23].cached_bytes;
    if (uVar21 <= uVar4) {
      if (uVar4 == uVar21) {
        uVar15 = uVar25 - 1;
        pCVar18 = cache + uVar25;
        uVar13 = pCVar18->cached_bytes;
        uVar14 = *(undefined4 *)&pCVar18->field_0x4;
        puVar6 = pCVar18->ptr;
        uVar12 = *(undefined4 *)&pCVar16->field_0x4;
        puVar7 = pCVar16->ptr;
        pCVar18 = cache + uVar25;
        pCVar18->cached_bytes = pCVar16->cached_bytes;
        *(undefined4 *)&pCVar18->field_0x4 = uVar12;
        pCVar18->ptr = puVar7;
        pCVar16->cached_bytes = uVar13;
        *(undefined4 *)&pCVar16->field_0x4 = uVar14;
        pCVar16->ptr = puVar6;
      }
      uVar23 = uVar23 - 1;
    }
    uVar25 = uVar15;
  } while (uVar21 <= uVar4);
  if (uVar20 <= uVar23) {
    pCVar16 = cache + uVar20;
    uVar13 = pCVar16->cached_bytes;
    uVar14 = *(undefined4 *)&pCVar16->field_0x4;
    puVar6 = pCVar16->ptr;
    pCVar16 = cache + uVar23;
    uVar12 = *(undefined4 *)&pCVar16->field_0x4;
    puVar7 = pCVar16->ptr;
    pCVar18 = cache + uVar20;
    pCVar18->cached_bytes = pCVar16->cached_bytes;
    *(undefined4 *)&pCVar18->field_0x4 = uVar12;
    pCVar18->ptr = puVar7;
    pCVar16 = cache + uVar23;
    pCVar16->cached_bytes = uVar13;
    *(undefined4 *)&pCVar16->field_0x4 = uVar14;
    pCVar16->ptr = puVar6;
    uVar20 = uVar20 + 1;
    uVar23 = uVar23 - 1;
    goto LAB_0022410f;
  }
  uVar31 = uVar20 - uVar28;
  uVar25 = uVar28;
  if (uVar31 < uVar28) {
    uVar25 = uVar31;
  }
  if (uVar25 != 0) {
    lVar17 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar17);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[uVar20 - uVar25].cached_bytes + lVar17);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache->cached_bytes + lVar17);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[uVar20 - uVar25].cached_bytes + lVar17);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar17 = lVar17 + 0x10;
    } while (uVar25 * 0x10 != lVar17);
  }
  uVar32 = uVar32 - uVar15;
  uVar15 = uVar15 - uVar23;
  uVar23 = uVar32;
  if (uVar15 < uVar32) {
    uVar23 = uVar15;
  }
  if (uVar23 != 0) {
    lVar17 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache[uVar20].cached_bytes + lVar17);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[N - uVar23].cached_bytes + lVar17);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache[uVar20].cached_bytes + lVar17);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[N - uVar23].cached_bytes + lVar17);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar17 = lVar17 + 0x10;
    } while (uVar23 * 0x10 != lVar17);
  }
  N = uVar32 + uVar28;
  multikey_cache<4u,false>(cache,uVar31,depth);
  cache = cache + uVar31;
  multikey_cache<4u,false>(cache + N,uVar15,depth);
  if ((char)uVar21 == '\0') {
    return;
  }
  depth = depth + 4;
  lVar30 = lVar30 + 4;
  goto LAB_00223f19;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}